

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

wchar_t player_get_channeling_boost(player *p)

{
  int iStack_20;
  wchar_t boost;
  long channeling;
  long max_channeling;
  player *p_local;
  
  iStack_20 = 0;
  if (0 < p->msp) {
    iStack_20 = (int)(((long)(p->lev * 2 + 0x2d) * (long)p->csp * (long)p->csp) /
                     (long)((int)p->msp * (int)p->msp));
  }
  return (iStack_20 + 5) / 10;
}

Assistant:

int player_get_channeling_boost(struct player *p)
{
	long max_channeling = 45 + (2 * p->lev);
	long channeling = 0L;
	int boost;

	if (p->msp > 0) {
		channeling = (max_channeling * p->csp * p->csp)	/ (p->msp * p->msp);
	}
	boost = ((int) channeling + 5) / 10;

	return boost;
}